

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O2

void __thiscall dlib::thread_pool_implementation::shutdown_pool(thread_pool_implementation *this)

{
  pointer ptVar1;
  ulong uVar2;
  long lVar3;
  void *in_RSI;
  task_state_type *task;
  task_state_type *this_00;
  thread *t;
  pointer ptVar4;
  auto_mutex M;
  auto_mutex local_38;
  
  local_38.m = &this->m;
  local_38.r = (rmutex *)0x0;
  local_38.rw = (read_write_mutex *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)local_38.m);
  uVar2 = 0;
  while (uVar2 < (this->tasks).array_size) {
    if ((this->tasks).array_elements[uVar2].task_id == 0) {
      uVar2 = uVar2 + 1;
    }
    else {
      signaler::wait(&this->task_done_signaler,in_RSI);
      uVar2 = 0;
    }
  }
  this->we_are_destructing = true;
  pthread_cond_broadcast((pthread_cond_t *)&(this->task_ready_signaler).cond);
  auto_mutex::~auto_mutex(&local_38);
  ptVar1 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar4 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::clear(&this->threads);
  this_00 = (this->tasks).array_elements;
  for (lVar3 = (this->tasks).array_size * 0x1a0; lVar3 != 0; lVar3 = lVar3 + -0x1a0) {
    task_state_type::propagate_exception(this_00);
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void thread_pool_implementation::
    shutdown_pool (
    )
    {
        {
            auto_mutex M(m);
            
            // first wait for all pending tasks to finish
            bool found_task = true;
            while (found_task)
            {
                found_task = false;
                for (unsigned long i = 0; i < tasks.size(); ++i)
                {
                    // If task bucket i has a task that is currently supposed to be processed
                    if (tasks[i].is_empty() == false)
                    {
                        found_task = true;
                        break;
                    }
                }

                if (found_task)
                    task_done_signaler.wait();
            }

            // now tell the threads to kill themselves
            we_are_destructing = true;
            task_ready_signaler.broadcast();
        }

        // wait for all threads to terminate
        for (auto& t : threads)
            t.join();
        threads.clear();

        // Throw any unhandled exceptions.  Since shutdown_pool() is only called in the
        // destructor this will kill the program.
        for (auto&& task : tasks)
            task.propagate_exception();
    }